

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<cov::dll_*>,_phmap::priv::HashEq<cov::dll_*,_void>::Hash,_phmap::priv::HashEq<cov::dll_*,_void>::Eq,_std::allocator<cov::dll_*>_>
::clear(raw_hash_set<phmap::priv::FlatHashSetPolicy<cov::dll_*>,_phmap::priv::HashEq<cov::dll_*,_void>::Hash,_phmap::priv::HashEq<cov::dll_*,_void>::Eq,_std::allocator<cov::dll_*>_>
        *this)

{
  ulong uVar1;
  
  if (this->size_ != 0) {
    uVar1 = this->capacity_;
    if (uVar1 < 0x80) {
      if (uVar1 != 0) {
        this->size_ = 0;
        memset(this->ctrl_,0x80,uVar1 + 0x10);
        this->ctrl_[uVar1] = -1;
        reset_growth_left(this,this->capacity_);
      }
    }
    else {
      destroy_slots(this);
    }
    if (this->size_ != 0) {
      __assert_fail("empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                    ,0x5a2,
                    "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<cov::dll *>, phmap::priv::HashEq<cov::dll *>::Hash, phmap::priv::HashEq<cov::dll *>::Eq, std::allocator<cov::dll *>>::clear() [Policy = phmap::priv::FlatHashSetPolicy<cov::dll *>, Hash = phmap::priv::HashEq<cov::dll *>::Hash, Eq = phmap::priv::HashEq<cov::dll *>::Eq, Alloc = std::allocator<cov::dll *>]"
                   );
    }
  }
  return;
}

Assistant:

bool empty() const
			{
				return !size();
			}